

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDelete(BtCursor *pCur)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  ushort uVar4;
  MemPage *pPage;
  BtShared *pBt;
  u8 *puVar5;
  MemPage *pPage_00;
  short sVar6;
  u16 uVar7;
  int iVar8;
  BtCursor *pBVar9;
  long lVar10;
  ulong uVar11;
  int rc;
  u16 szCell;
  int notUsed;
  int local_74;
  long local_70;
  BtShared *local_68;
  Btree *local_60;
  undefined4 local_58;
  ushort local_52;
  ulong local_50;
  u8 *local_48;
  MemPage *local_40;
  int local_34;
  
  local_70 = (long)pCur->iPage;
  uVar3 = pCur->aiIdx[local_70];
  pPage = pCur->apPage[local_70];
  iVar8 = 1;
  if ((uVar3 < pPage->nCell) && (pCur->eState == '\x01')) {
    local_60 = pCur->pBtree;
    pBt = local_60->pBt;
    uVar4 = pPage->maskPage;
    uVar1 = pPage->aCellIdx[(ulong)uVar3 * 2];
    uVar2 = pPage->aCellIdx[(ulong)uVar3 * 2 + 1];
    puVar5 = pPage->aData;
    if (pPage->leaf == '\0') {
      local_34 = 0;
      iVar8 = sqlite3BtreePrevious(pCur,&local_34);
      if (iVar8 != 0) {
        return iVar8;
      }
      local_74 = 0;
      local_58 = 0;
    }
    iVar8 = saveAllCursors(pBt,pCur->pgnoRoot,pCur);
    if (iVar8 == 0) {
      if ((pCur->pKeyInfo == (KeyInfo *)0x0) &&
         (pBVar9 = local_60->pBt->pCursor, pBVar9 != (BtCursor *)0x0)) {
        lVar10 = (pCur->info).nKey;
        do {
          if (((pBVar9->curFlags & 0x10) != 0) && ((pBVar9->info).nKey == lVar10)) {
            pBVar9->eState = '\0';
          }
          pBVar9 = pBVar9->pNext;
        } while (pBVar9 != (BtCursor *)0x0);
      }
      local_74 = iVar8;
      iVar8 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar8 == 0) {
        local_74 = iVar8;
        local_74 = clearCell(pPage,puVar5 + (CONCAT11(uVar1,uVar2) & uVar4),&local_52);
        dropCell(pPage,(uint)uVar3,(uint)local_52,&local_74);
        iVar8 = local_74;
        if (local_74 == 0) {
          if (pPage->leaf == '\0') {
            pPage_00 = pCur->apPage[pCur->iPage];
            local_60 = (Btree *)CONCAT44(local_60._4_4_,pCur->apPage[local_70 + 1]->pgno);
            local_48 = pPage_00->aData;
            uVar11 = (ulong)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                      pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                            pPage_00->maskPage);
            local_68 = pBt;
            local_40 = pPage_00;
            uVar7 = cellSizePtr(pPage_00,local_48 + uVar11);
            local_50 = (ulong)uVar7;
            local_68 = (BtShared *)local_68->pTmpSpace;
            local_74 = sqlite3PagerWrite(pPage_00->pDbPage);
            iVar8 = (int)local_50;
            insertCell(pPage,(uint)uVar3,local_48 + (uVar11 - 4),iVar8 + 4,(u8 *)local_68,
                       (Pgno)local_60,&local_74);
            dropCell(local_40,local_40->nCell - 1,iVar8,&local_74);
            if (local_74 != 0) {
              return local_74;
            }
          }
          local_74 = balance(pCur);
          if ((local_74 == 0) && ((short)local_70 < pCur->iPage)) {
            local_74 = 0;
            sVar6 = pCur->iPage;
            lVar10 = local_70;
            while ((short)lVar10 < sVar6) {
              pCur->iPage = sVar6 + -1;
              if (pCur->apPage[sVar6] != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pCur->apPage[sVar6]->pDbPage);
                lVar10 = local_70;
              }
              sVar6 = pCur->iPage;
            }
            local_74 = balance(pCur);
          }
          iVar8 = local_74;
          if (local_74 == 0) {
            moveToRoot(pCur);
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  u16 szCell;                          /* Size of the cell being deleted */

  assert( cursorHoldsMutex(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );

  if( NEVER(pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell) 
   || NEVER(pCur->eState!=CURSOR_VALID)
  ){
    return SQLITE_ERROR;  /* Something has gone awry. */
  }

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->aiIdx[iCellDepth];
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    int notUsed = 0;
    rc = sqlite3BtreePrevious(pCur, &notUsed);
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications. Make the page containing the entry to be 
  ** deleted writable. Then free any overflow pages associated with the 
  ** entry and finally remove the cell itself from within the page.  
  */
  rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
  if( rc ) return rc;

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->info.nKey, 0);
  }

  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &szCell);
  dropCell(pPage, iCellIdx, szCell, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    nCell = cellSizePtr(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    moveToRoot(pCur);
  }
  return rc;
}